

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclKernel.cpp
# Opt level: O0

void __thiscall
xmrig::OclKernel::enqueueNDRange
          (OclKernel *this,cl_command_queue queue,uint32_t work_dim,size_t *global_work_offset,
          size_t *global_work_size,size_t *local_work_size)

{
  cl_int ret_00;
  char *pcVar1;
  char *pcVar2;
  String *this_00;
  char *pcVar3;
  runtime_error *this_01;
  cl_uint in_ECX;
  undefined4 in_EDX;
  cl_event *in_RSI;
  OclKernel *in_RDI;
  cl_int ret;
  size_t *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffa0;
  size_t *in_stack_ffffffffffffffa8;
  cl_kernel in_stack_ffffffffffffffb8;
  cl_command_queue in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  
  ret_00 = OclLib::enqueueNDRangeKernel
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      (cl_uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8,
                      in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_ECX,
                      (cl_event *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RSI);
  if (ret_00 != 0) {
    pcVar1 = ocl_tag();
    pcVar2 = OclError::toString(ret_00);
    this_00 = name(in_RDI);
    pcVar3 = String::data(this_00);
    Log::print(ERR,
               "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31mclEnqueueNDRangeKernel\x1b[0m\x1b[0;31m for kernel \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar1,pcVar2,pcVar3);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar1 = OclError::toString(ret_00);
    std::runtime_error::runtime_error(this_01,pcVar1);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void xmrig::OclKernel::enqueueNDRange(cl_command_queue queue, uint32_t work_dim, const size_t *global_work_offset, const size_t *global_work_size, const size_t *local_work_size)
{
    const cl_int ret = OclLib::enqueueNDRangeKernel(queue, m_kernel, work_dim, global_work_offset, global_work_size, local_work_size, 0, nullptr, nullptr);
    if (ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("clEnqueueNDRangeKernel") RED(" for kernel ") RED_BOLD("%s"),
                ocl_tag(), OclError::toString(ret), name().data());

        throw std::runtime_error(OclError::toString(ret));
    }
}